

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int blobSeekToRow(Incrblob *p,sqlite3_int64 iRow,char **pzErr)

{
  uint uVar1;
  sqlite3_stmt *psVar2;
  undefined8 *puVar3;
  sqlite3 *db;
  BtCursor *pBVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  
  psVar2 = p->pStmt;
  *(sqlite3_int64 *)(*(long *)(psVar2 + 0x78) + 0x18) = iRow;
  iVar5 = sqlite3_step(p->pStmt);
  if (iVar5 == 100) {
    puVar3 = (undefined8 *)**(long **)(psVar2 + 0x70);
    uVar1 = *(uint *)(puVar3[0xe] + (long)p->iCol * 4);
    if (0xb < uVar1) {
      p->iOffset = *(int *)(puVar3[0xf] + (long)p->iCol * 4);
      p->nByte = uVar1 - 0xc >> 1;
      pBVar4 = (BtCursor *)*puVar3;
      p->pCsr = pBVar4;
      sqlite3BtreeEnterCursor(pBVar4);
      pBVar4 = p->pCsr;
      invalidateOverflowCache(pBVar4);
      pBVar4->isIncrblobHandle = '\x01';
      sqlite3BtreeLeaveCursor(p->pCsr);
      pcVar7 = (char *)0x0;
      iVar5 = 0;
      goto LAB_0013b481;
    }
    pcVar7 = "integer";
    if (uVar1 == 7) {
      pcVar7 = "real";
    }
    pcVar6 = "null";
    if (uVar1 != 0) {
      pcVar6 = pcVar7;
    }
    pcVar7 = sqlite3MPrintf(p->db,"cannot open value of type %s",pcVar6);
    sqlite3_finalize(p->pStmt);
    p->pStmt = (sqlite3_stmt *)0x0;
  }
  else {
    if (p->pStmt == (sqlite3_stmt *)0x0) {
      pcVar7 = (char *)0x0;
      goto LAB_0013b481;
    }
    iVar5 = sqlite3_finalize(p->pStmt);
    p->pStmt = (sqlite3_stmt *)0x0;
    db = p->db;
    if (iVar5 != 0) {
      pcVar7 = sqlite3_errmsg(db);
      pcVar7 = sqlite3MPrintf(db,"%s",pcVar7);
      goto LAB_0013b481;
    }
    pcVar7 = sqlite3MPrintf(db,"no such rowid: %lld",iRow);
  }
  iVar5 = 1;
LAB_0013b481:
  *pzErr = pcVar7;
  return iVar5;
}

Assistant:

static int blobSeekToRow(Incrblob *p, sqlite3_int64 iRow, char **pzErr){
  int rc;                         /* Error code */
  char *zErr = 0;                 /* Error message */
  Vdbe *v = (Vdbe *)p->pStmt;

  /* Set the value of the SQL statements only variable to integer iRow. 
  ** This is done directly instead of using sqlite3_bind_int64() to avoid 
  ** triggering asserts related to mutexes.
  */
  assert( v->aVar[0].flags&MEM_Int );
  v->aVar[0].u.i = iRow;

  rc = sqlite3_step(p->pStmt);
  if( rc==SQLITE_ROW ){
    u32 type = v->apCsr[0]->aType[p->iCol];
    if( type<12 ){
      zErr = sqlite3MPrintf(p->db, "cannot open value of type %s",
          type==0?"null": type==7?"real": "integer"
      );
      rc = SQLITE_ERROR;
      sqlite3_finalize(p->pStmt);
      p->pStmt = 0;
    }else{
      p->iOffset = v->apCsr[0]->aOffset[p->iCol];
      p->nByte = sqlite3VdbeSerialTypeLen(type);
      p->pCsr =  v->apCsr[0]->pCursor;
      sqlite3BtreeEnterCursor(p->pCsr);
      sqlite3BtreeCacheOverflow(p->pCsr);
      sqlite3BtreeLeaveCursor(p->pCsr);
    }
  }

  if( rc==SQLITE_ROW ){
    rc = SQLITE_OK;
  }else if( p->pStmt ){
    rc = sqlite3_finalize(p->pStmt);
    p->pStmt = 0;
    if( rc==SQLITE_OK ){
      zErr = sqlite3MPrintf(p->db, "no such rowid: %lld", iRow);
      rc = SQLITE_ERROR;
    }else{
      zErr = sqlite3MPrintf(p->db, "%s", sqlite3_errmsg(p->db));
    }
  }

  assert( rc!=SQLITE_OK || zErr==0 );
  assert( rc!=SQLITE_ROW && rc!=SQLITE_DONE );

  *pzErr = zErr;
  return rc;
}